

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlDebugDumpDTD(FILE *output,xmlDtdPtr dtd)

{
  xmlNodePtr node;
  size_t __size;
  char *__ptr;
  xmlDebugCtxt local_b0;
  
  if (output == (FILE *)0x0) {
    output = (FILE *)_stdout;
  }
  local_b0.depth = 0;
  local_b0.check = 0;
  local_b0.errors = 0;
  local_b0.nodict = 0;
  local_b0.options = 1;
  local_b0.doc = (xmlDocPtr)0x0;
  local_b0.node = (xmlNodePtr)0x0;
  local_b0.dict = (xmlDictPtr)0x0;
  builtin_strncpy(local_b0.shift,
                  "                                                                                                    "
                  ,0x65);
  local_b0.output = output;
  if (dtd == (xmlDtdPtr)0x0) {
    __ptr = "DTD is NULL\n";
    __size = 0xc;
  }
  else {
    xmlCtxtDumpDtdNode(&local_b0,dtd);
    node = dtd->children;
    if (node != (xmlNodePtr)0x0) {
      local_b0.depth = local_b0.depth + 1;
      do {
        xmlCtxtDumpNode(&local_b0,node);
        node = node->next;
      } while (node != (_xmlNode *)0x0);
      return;
    }
    __ptr = "    DTD is empty\n";
    __size = 0x11;
  }
  fwrite(__ptr,__size,1,(FILE *)local_b0.output);
  return;
}

Assistant:

void
xmlDebugDumpDTD(FILE * output, xmlDtdPtr dtd)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.options |= DUMP_TEXT_TYPE;
    ctxt.output = output;
    xmlCtxtDumpDTD(&ctxt, dtd);
    xmlCtxtDumpCleanCtxt(&ctxt);
}